

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void absl::lts_20250127::container_internal::ResetGrowthLeft(CommonFields *common)

{
  GrowthInfo *this;
  size_t sVar1;
  size_t sVar2;
  CommonFields *common_local;
  
  this = CommonFields::growth_info(common);
  sVar1 = CommonFields::capacity(common);
  sVar1 = CapacityToGrowth(sVar1);
  sVar2 = CommonFields::size(common);
  GrowthInfo::InitGrowthLeftNoDeleted(this,sVar1 - sVar2);
  return;
}

Assistant:

inline void ResetGrowthLeft(CommonFields& common) {
  common.growth_info().InitGrowthLeftNoDeleted(
      CapacityToGrowth(common.capacity()) - common.size());
}